

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O0

void __thiscall
QAbstractScrollArea::setSizeAdjustPolicy(QAbstractScrollArea *this,SizeAdjustPolicy policy)

{
  long lVar1;
  QAbstractScrollAreaPrivate *pQVar2;
  SizeAdjustPolicy in_ESI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QAbstractScrollAreaPrivate *d;
  QSize local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QAbstractScrollArea *)0x499cde);
  if (pQVar2->sizeAdjustPolicy != in_ESI) {
    pQVar2->sizeAdjustPolicy = in_ESI;
    QSize::QSize((QSize *)in_RDI);
    pQVar2->sizeHint = local_10;
    QWidget::updateGeometry(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractScrollArea::setSizeAdjustPolicy(SizeAdjustPolicy policy)
{
    Q_D(QAbstractScrollArea);
    if (d->sizeAdjustPolicy == policy)
        return;

    d->sizeAdjustPolicy = policy;
    d->sizeHint = QSize();
    updateGeometry();
}